

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_external_file_cache.cpp
# Opt level: O2

void duckdb::DuckDBExternalFileCacheFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference pvVar2;
  long lVar3;
  _func_int **pp_Var4;
  _func_int **__n;
  _func_int **pp_Var5;
  ulong index;
  Value local_90;
  string local_50;
  
  pGVar1 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar1[4]._vptr_GlobalTableFunctionState;
  pp_Var5 = pGVar1[1]._vptr_GlobalTableFunctionState;
  pp_Var4 = pGVar1[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)(((long)pp_Var4 - (long)pp_Var5) / 0x38)) {
    for (index = 0;
        (__n < (_func_int **)(((long)pp_Var4 - (long)pp_Var5) / 0x38) && (index < 0x800));
        index = index + 1) {
      pGVar1[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar2 = vector<duckdb::CachedFileInformation,_true>::get<true>
                         ((vector<duckdb::CachedFileInformation,_true> *)(pGVar1 + 1),(size_type)__n
                         );
      ::std::__cxx11::string::string((string *)&local_50,(string *)pvVar2);
      Value::Value(&local_90,&local_50);
      DataChunk::SetValue(output,0,index,&local_90);
      Value::~Value(&local_90);
      ::std::__cxx11::string::~string((string *)&local_50);
      lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar2->nr_bytes);
      Value::BIGINT(&local_90,lVar3);
      DataChunk::SetValue(output,1,index,&local_90);
      Value::~Value(&local_90);
      lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar2->location);
      Value::BIGINT(&local_90,lVar3);
      DataChunk::SetValue(output,2,index,&local_90);
      Value::~Value(&local_90);
      Value::Value(&local_90,(uint)pvVar2->loaded);
      DataChunk::SetValue(output,3,index,&local_90);
      Value::~Value(&local_90);
      __n = pGVar1[4]._vptr_GlobalTableFunctionState;
      pp_Var5 = pGVar1[1]._vptr_GlobalTableFunctionState;
      pp_Var4 = pGVar1[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBExternalFileCacheFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBExternalFileCacheData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];
		// return values:
		idx_t col = 0;
		// path, VARCHAR
		output.SetValue(col++, count, entry.path);
		// nr_bytes, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.nr_bytes)));
		// location, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.location)));
		// loaded, BOOLEAN
		output.SetValue(col++, count, entry.loaded);
		count++;
	}
	output.SetCardinality(count);
}